

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsString(AMFImporter *this,string *pValue)

{
  uint uVar1;
  int iVar2;
  DeadlyImportError *pDVar3;
  undefined4 extraout_var;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *pValue_local;
  AMFImporter *this_local;
  
  local_18 = pValue;
  pValue_local = (string *)this;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((uVar1 & 1) == 0) {
    local_4d = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"XML_ReadNode_GetVal_AsString. No data, seems file is corrupt.",
               &local_39);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
    local_4d = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar2 != 3) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "XML_ReadNode_GetVal_AsString. Invalid type of XML element, seems file is corrupt.",
               &local_71);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_70);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
  std::__cxx11::string::operator=((string *)local_18,(char *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void AMFImporter::XML_ReadNode_GetVal_AsString(std::string& pValue)
{
	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsString. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT)
		throw DeadlyImportError("XML_ReadNode_GetVal_AsString. Invalid type of XML element, seems file is corrupt.");

	pValue = mReader->getNodeData();
}